

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::TextureUploadCase::TextureUploadCase
          (TextureUploadCase *this,Context *context,char *name,char *description,
          UploadFunction uploadFunction,deUint32 format,deUint32 type,int texSize)

{
  deUint32 seed;
  TestContext *this_00;
  TestLog *pTVar1;
  deUint32 format_local;
  UploadFunction uploadFunction_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureUploadCase *this_local;
  
  gles2::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUploadCase_03283190;
  this->m_uploadFunction = uploadFunction;
  this->m_format = format;
  this->m_type = type;
  this->m_texSize = texSize;
  this->m_alignment = 4;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  this->m_program = (ShaderProgram *)0x0;
  this->m_texture = 0;
  seed = deStringHash(name);
  de::Random::Random(&this->m_rnd,seed);
  this_00 = gles2::Context::getTestContext(context);
  pTVar1 = tcu::TestContext::getLog(this_00);
  this->m_log = pTVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_texData);
  return;
}

Assistant:

TextureUploadCase::TextureUploadCase (Context& context, const char* name, const char* description, UploadFunction uploadFunction, deUint32 format, deUint32 type, int texSize)
	: TestCase			(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_uploadFunction	(uploadFunction)
	, m_format			(format)
	, m_type			(type)
	, m_texSize			(texSize)
	, m_alignment		(4)
	, m_calibrator		()
	, m_program			(DE_NULL)
	, m_texture			(0)
	, m_rnd				(deStringHash(name))
	, m_log				(context.getTestContext().getLog())
{
}